

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

Vector2 MeasureTextEx(Font font,char *text,float fontSize,float spacing)

{
  Vector2 VVar1;
  int iVar2;
  ulong uVar3;
  CharInfo *pCVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  int local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  Rectangle *local_68;
  char *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  
  lVar9 = 0;
  if ((text != (char *)0x0) && (*text != '\0')) {
    lVar9 = 0;
    do {
      lVar5 = lVar9 + 1;
      lVar9 = lVar9 + 1;
    } while (text[lVar5] != '\0');
  }
  local_74 = (float)font.baseSize;
  local_78 = local_74;
  local_70 = spacing;
  local_48 = fontSize;
  if ((int)lVar9 < 1) {
    fVar10 = 0.0;
    fVar11 = -1.0;
    local_58 = 0.0;
  }
  else {
    local_68 = font.recs;
    local_58 = 0.0;
    iVar6 = 0;
    local_6c = local_74 * 1.5;
    fVar10 = 0.0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    iVar7 = 0;
    iVar8 = 0;
    local_60 = text;
    do {
      local_80 = 0;
      local_7c = local_58;
      local_58 = fVar10;
      iVar2 = GetNextCodepoint(local_60 + iVar6,&local_80);
      if (font.charsCount < 1) {
        lVar5 = 0x3f;
      }
      else {
        uVar3 = 0;
        pCVar4 = font.chars;
        do {
          if (pCVar4->value == iVar2) goto LAB_00132d4c;
          uVar3 = uVar3 + 1;
          pCVar4 = pCVar4 + 1;
        } while ((uint)font.charsCount != uVar3);
        uVar3 = 0x3f;
LAB_00132d4c:
        lVar5 = (long)(int)uVar3;
      }
      if (iVar2 == 0x3f) {
        local_80 = 1;
      }
      if (iVar2 == 10) {
        if (local_58 <= local_7c) {
          local_58 = local_7c;
        }
        local_78 = local_78 + local_6c;
        fVar10 = 0.0;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        iVar7 = 0;
      }
      else {
        iVar7 = iVar7 + 1;
        if (font.chars[lVar5].advanceX == 0) {
          fVar10 = (float)font.chars[lVar5].offsetX + local_68[lVar5].width;
        }
        else {
          fVar10 = (float)font.chars[lVar5].advanceX;
        }
        fVar10 = local_58 + fVar10;
        local_58 = local_7c;
      }
      if (iVar8 <= iVar7) {
        iVar8 = iVar7;
      }
      iVar6 = iVar6 + local_80;
    } while (iVar6 < (int)lVar9);
    fVar11 = (float)(iVar8 + -1);
  }
  if (fVar10 <= local_58) {
    fVar10 = local_58;
  }
  VVar1.y = (local_48 / local_74) * local_78;
  VVar1.x = fVar10 * (local_48 / local_74) + fVar11 * local_70;
  return VVar1;
}

Assistant:

Vector2 MeasureTextEx(Font font, const char *text, float fontSize, float spacing)
{
    int len = TextLength(text);
    int tempLen = 0;                // Used to count longer text line num chars
    int lenCounter = 0;

    float textWidth = 0.0f;
    float tempTextWidth = 0.0f;     // Used to count longer text line width

    float textHeight = (float)font.baseSize;
    float scaleFactor = fontSize/(float)font.baseSize;

    int letter = 0;                 // Current character
    int index = 0;                  // Index position in sprite font

    for (int i = 0; i < len; i++)
    {
        lenCounter++;

        int next = 0;
        letter = GetNextCodepoint(&text[i], &next);
        index = GetGlyphIndex(font, letter);

        // NOTE: normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set next = 1
        if (letter == 0x3f) next = 1;
        i += next - 1;

        if (letter != '\n')
        {
            if (font.chars[index].advanceX != 0) textWidth += font.chars[index].advanceX;
            else textWidth += (font.recs[index].width + font.chars[index].offsetX);
        }
        else
        {
            if (tempTextWidth < textWidth) tempTextWidth = textWidth;
            lenCounter = 0;
            textWidth = 0;
            textHeight += ((float)font.baseSize*1.5f); // NOTE: Fixed line spacing of 1.5 lines
        }

        if (tempLen < lenCounter) tempLen = lenCounter;
    }

    if (tempTextWidth < textWidth) tempTextWidth = textWidth;

    Vector2 vec = { 0 };
    vec.x = tempTextWidth*scaleFactor + (float)((tempLen - 1)*spacing); // Adds chars spacing to measure
    vec.y = textHeight*scaleFactor;

    return vec;
}